

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_v_predictor_4x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  __m128i y_select;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2 = _DAT_0051a820;
  uVar1 = *(undefined4 *)top_row;
  auVar6 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  auVar4[0] = (byte)uVar1;
  auVar4[1] = 0;
  auVar7._0_12_ = ZEXT712(0);
  auVar7[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar7[0xd] = 0;
  auVar7._14_2_ = auVar6._6_2_;
  auVar5._12_4_ = auVar7._12_4_;
  auVar5._0_10_ = (unkuint10)0;
  auVar5._10_2_ = auVar6._4_2_;
  auVar4[9] = 0;
  auVar4[8] = (byte)((uint)uVar1 >> 0x10);
  auVar4._10_6_ = auVar5._10_6_;
  auVar4._6_2_ = auVar6._2_2_;
  auVar4[5] = 0;
  auVar4[4] = (byte)((uint)uVar1 >> 8);
  auVar4._2_2_ = auVar6._0_2_;
  iVar3 = 4;
  auVar5 = _DAT_0051a800;
  do {
    auVar7 = pshufb(ZEXT816(0x400055009500ff),auVar5);
    auVar6 = pshufb(auVar2,auVar5);
    auVar11._0_12_ = auVar7._0_12_;
    auVar11._12_2_ = auVar7._6_2_;
    auVar11._14_2_ = auVar6._6_2_;
    auVar10._12_4_ = auVar11._12_4_;
    auVar10._0_10_ = auVar7._0_10_;
    auVar10._10_2_ = auVar6._4_2_;
    auVar9._10_6_ = auVar10._10_6_;
    auVar9._0_8_ = auVar7._0_8_;
    auVar9._8_2_ = auVar7._4_2_;
    auVar8._8_8_ = auVar9._8_8_;
    auVar8._6_2_ = auVar6._2_2_;
    auVar8._4_2_ = auVar7._2_2_;
    auVar8._0_2_ = auVar7._0_2_;
    auVar8._2_2_ = auVar6._0_2_;
    auVar7 = pmaddwd(auVar8,auVar4);
    auVar12._0_4_ = auVar7._0_4_ + 0x80;
    auVar12._4_4_ = auVar7._4_4_ + 0x80;
    auVar12._8_4_ = auVar7._8_4_ + 0x80;
    auVar12._12_4_ = auVar7._12_4_ + 0x80;
    auVar7 = pshufb(auVar12,ZEXT416(0xd090501));
    *(int *)dst = auVar7._0_4_;
    dst = dst + stride;
    auVar6._0_2_ = auVar5._0_2_ + 0x202;
    auVar6._2_2_ = auVar5._2_2_ + 0x202;
    auVar6._4_2_ = auVar5._4_2_ + 0x202;
    auVar6._6_2_ = auVar5._6_2_ + 0x202;
    auVar6._8_2_ = auVar5._8_2_ + 0x202;
    auVar6._10_2_ = auVar5._10_2_ + 0x202;
    auVar6._12_2_ = auVar5._12_2_ + 0x202;
    auVar6._14_2_ = auVar5._14_2_ + 0x202;
    iVar3 = iVar3 + -1;
    auVar5 = auVar6;
  } while (iVar3 != 0);
  return;
}

Assistant:

static AOM_FORCE_INLINE __m128i Load4(const void *src) {
  // With new compilers such as clang 8.0.0 we can use the new _mm_loadu_si32
  // intrinsic. Both _mm_loadu_si32(src) and the code here are compiled into a
  // movss instruction.
  //
  // Until compiler support of _mm_loadu_si32 is widespread, use of
  // _mm_loadu_si32 is banned.
  int val;
  memcpy(&val, src, sizeof(val));
  return _mm_cvtsi32_si128(val);
}